

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O1

void __thiscall Blowfish_CFB_Test::TestBody(Blowfish_CFB_Test *this)

{
  int iVar1;
  EVP_CIPHER *pEVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  BlowfishTestCase *key;
  ScopedTrace gtest_trace_136;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_;
  int out_bytes;
  int final_bytes;
  uint test_num;
  uint8_t out [16];
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  ScopedEVP_CIPHER_CTX ctx;
  ScopedTrace local_1e1;
  undefined1 local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  Bytes local_1b0;
  AssertHelper local_1a0;
  int local_194;
  int local_190;
  uint local_18c;
  long local_188 [3];
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [8];
  long local_d8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  
  local_18c = 0;
  key = kTests;
  lVar4 = 0xc0;
  do {
    local_18c = local_18c + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1e1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x88,&local_18c);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    pEVar2 = (EVP_CIPHER *)EVP_bf_cfb();
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,pEVar2,(ENGINE *)0x0,
                               key->key,key->iv);
    local_1d0[0] = (internal)(iVar1 != 0);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_cfb(), nullptr, test.key, test.iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x8f,(char *)CONCAT71(local_170._1_7_,local_170[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
LAB_00121ac8:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_170._1_7_,local_170[0]) != local_160) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_170._1_7_,local_170[0]),
                        local_160[0]._M_allocated_capacity + 1);
      }
      if (local_1e0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1e0 + 8))();
      }
      if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c8,local_1c8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
LAB_00121ca7:
      testing::ScopedTrace::~ScopedTrace(&local_1e1);
      return;
    }
    local_d0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )key->plaintext;
    local_d8 = lVar4;
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,(uchar *)local_188,
                              &local_194,
                              (uchar *)local_d0._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,0x10);
    local_1d0[0] = (internal)(iVar1 != 0);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_1d0,
                 (AssertionResult *)
                 "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x91,(char *)CONCAT71(local_170._1_7_,local_170[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
      goto LAB_00121ac8;
    }
    iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&stack0xffffffffffffff38,
                                (uchar *)((long)local_188 + (long)local_194),&local_190);
    local_1d0[0] = (internal)(iVar1 != 0);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_1d0,
                 (AssertionResult *)"EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x92,(char *)CONCAT71(local_170._1_7_,local_170[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
      goto LAB_00121ac8;
    }
    local_1d0 = (undefined1  [8])((long)local_190 + (long)local_194);
    local_1e0 = (undefined1  [8])0x10;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_170,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1d0,(unsigned_long *)local_1e0);
    if (local_170[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar3 = "";
      if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_168->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x94,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d0 + 8))();
      }
    }
    if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,local_168);
    }
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1e0 = (undefined1  [8])local_188;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
    local_1d0 = (undefined1  [8])key->cfb_ciphertext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_170,"Bytes(test.cfb_ciphertext)","Bytes(out)",(Bytes *)local_1d0,
               (Bytes *)local_1e0);
    if (local_170[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d0);
      pcVar3 = "";
      if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_168->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x95,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1d0 + 8))();
      }
    }
    if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168,local_168);
    }
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_170);
    pEVar2 = (EVP_CIPHER *)EVP_bf_cfb();
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_170,pEVar2,(ENGINE *)0x0,key->key,key->iv);
    local_1e0[0] = iVar1 != 0;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d0,(internal *)local_1e0,
                 (AssertionResult *)
                 "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cfb(), nullptr, test.key, test.iv)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x99,(char *)local_1d0);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1b0);
LAB_00121c47:
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (local_1d0 != (undefined1  [8])&local_1c0) {
        operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
      }
      if ((long *)local_1b0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_1b0.span_.data_ + 8))();
      }
      if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d8,local_1d8);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_170);
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
      goto LAB_00121ca7;
    }
    iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_170,(uchar *)local_188,&local_194,
                              key->cfb_ciphertext,0x10);
    local_1e0[0] = iVar1 != 0;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d0,(internal *)local_1e0,
                 (AssertionResult *)
                 "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.cfb_ciphertext, sizeof(test.cfb_ciphertext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x9c,(char *)local_1d0);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1b0);
      goto LAB_00121c47;
    }
    iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)local_170,
                                (uchar *)((long)local_188 + (long)local_194),&local_190);
    local_1e0[0] = iVar1 != 0;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d0,(internal *)local_1e0,
                 (AssertionResult *)
                 "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x9e,(char *)local_1d0);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1b0);
      goto LAB_00121c47;
    }
    local_1e0 = (undefined1  [8])((long)local_190 + (long)local_194);
    local_1b0.span_.data_ = &DAT_00000010;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1d0,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)local_1e0,(unsigned_long *)&local_1b0);
    if (local_1d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1e0);
      pcVar3 = "";
      if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_1c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0xa0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
      if (local_1e0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1e0 + 8))();
      }
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
    local_1e0 = (undefined1  [8])
                local_d0._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1b0.span_.data_ = (uchar *)local_188;
    local_1b0.span_.size_ = 0x10;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1d0,"Bytes(test.plaintext)","Bytes(out)",(Bytes *)local_1e0,
               &local_1b0);
    lVar4 = local_d8;
    if (local_1d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1e0);
      pcVar3 = "";
      if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_1c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0xa1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
      if (local_1e0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1e0 + 8))();
      }
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_170);
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&stack0xffffffffffffff38);
    testing::ScopedTrace::~ScopedTrace(&local_1e1);
    key = key + 1;
    lVar4 = lVar4 + -0x60;
    if (lVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Blowfish, CFB) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.cfb_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_cfb(), nullptr, test.key,
                                   test.iv));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    ASSERT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.cfb_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cfb(), nullptr,
                                   test.key, test.iv));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.cfb_ciphertext,
                                  sizeof(test.cfb_ciphertext)));
    ASSERT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out));
  }
}